

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O0

void __thiscall
spvtools::opt::RegisterLiveness::ComputeLoopRegisterPressure
          (RegisterLiveness *this,Loop *loop,RegionRegisterLiveness *loop_reg_pressure)

{
  uint32_t blk_id;
  bool bVar1;
  bool bVar2;
  Op OVar3;
  BasicBlock *bb_00;
  reference puVar4;
  const_iterator __first;
  reference ppIVar5;
  BasicBlockListTy *this_00;
  reference pvVar6;
  CFG *this_01;
  RegionRegisterLiveness *pRVar7;
  unsigned_long *puVar8;
  size_type sVar9;
  uint32_t local_194;
  Instruction *local_190;
  Instruction *insn_2;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  RegionRegisterLiveness *live_inout_1;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_158;
  uint32_t bb_id_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  BasicBlockListTy *__range2_3;
  uint32_t local_130;
  uint32_t local_12c;
  Instruction *local_128;
  Instruction *insn_1;
  iterator __end2_2;
  iterator __begin2_2;
  LiveSet *__range2_2;
  uint32_t local_f4;
  Instruction *local_f0;
  Instruction *insn;
  iterator __end2_1;
  iterator __begin2_1;
  LiveSet *__range2_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_insn;
  RegionRegisterLiveness *live_inout;
  _Node_iterator_base<unsigned_int,_false> _Stack_78;
  uint32_t bb_id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  RegionRegisterLiveness *header_live_inout;
  RegionRegisterLiveness *loop_reg_pressure_local;
  Loop *loop_local;
  RegisterLiveness *this_local;
  
  RegionRegisterLiveness::Clear(loop_reg_pressure);
  bb_00 = Loop::GetHeaderBlock(loop);
  exit_blocks._M_h._M_single_bucket = (__node_base_ptr)Get(this,bb_00);
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::operator=(&loop_reg_pressure->live_in_,
              (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               *)exit_blocks._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  Loop::GetExitBlocks(loop,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__range2);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  _Stack_78._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xffffffffffffff88), bVar1) {
    puVar4 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    pRVar7 = Get(this,*puVar4);
    __first = std::
              unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::begin(&pRVar7->live_in_);
    seen_insn._M_h._M_single_bucket =
         (__node_base_ptr)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end(&pRVar7->live_in_);
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::insert<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)&loop_reg_pressure->live_out_,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               __first.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               seen_insn._M_h._M_single_bucket);
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2_1);
  __end2_1 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&loop_reg_pressure->live_out_);
  insn = (Instruction *)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end(&loop_reg_pressure->live_out_);
  while (bVar1 = std::__detail::operator!=
                           (&__end2_1.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>
                            ,(_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&insn),
        bVar1) {
    ppIVar5 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                        (&__end2_1);
    local_f0 = *ppIVar5;
    RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,local_f0);
    local_f4 = Instruction::result_id(local_f0);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2_1,&local_f4);
    std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++(&__end2_1);
  }
  __end2_2 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&loop_reg_pressure->live_in_);
  insn_1 = (Instruction *)
           std::
           unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(&loop_reg_pressure->live_in_);
  while (bVar1 = std::__detail::operator!=
                           (&__end2_2.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>
                            ,(_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&insn_1),
        bVar1) {
    ppIVar5 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                        (&__end2_2);
    local_128 = *ppIVar5;
    local_12c = Instruction::result_id(local_128);
    sVar9 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&__range2_1,&local_12c);
    if (sVar9 != 0) {
      RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,local_128);
      local_130 = Instruction::result_id(local_128);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&__range2_1,&local_130);
    }
    std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++(&__end2_2);
  }
  loop_reg_pressure->used_registers_ = 0;
  this_00 = Loop::GetBlocks(loop);
  __end2_3 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::begin(this_00);
  _Stack_158._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_3.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xfffffffffffffea8);
    if (!bVar1) {
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range2_1);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range2);
      return;
    }
    pvVar6 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2_3);
    blk_id = *pvVar6;
    this_01 = IRContext::cfg(this->context_);
    CFG::block(this_01,blk_id);
    pRVar7 = Get(this,blk_id);
    if (pRVar7 == (RegionRegisterLiveness *)0x0) break;
    puVar8 = std::max<unsigned_long>(&loop_reg_pressure->used_registers_,&pRVar7->used_registers_);
    loop_reg_pressure->used_registers_ = *puVar8;
    BasicBlock::begin((BasicBlock *)&__end3);
    BasicBlock::end((BasicBlock *)&insn_2);
    while (bVar1 = utils::operator!=(&__end3.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&insn_2),
          bVar1) {
      local_190 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      OVar3 = Instruction::opcode(local_190);
      bVar1 = true;
      if (OVar3 != OpPhi) {
        bVar2 = anon_unknown_8::CreatesRegisterUsage(local_190);
        bVar1 = true;
        if (bVar2) {
          local_194 = Instruction::result_id(local_190);
          sVar9 = std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&__range2_1,&local_194);
          bVar1 = sVar9 != 0;
        }
      }
      if (!bVar1) {
        RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,local_190);
      }
      InstructionList::iterator::operator++(&__end3);
    }
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2_3);
  }
  __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0x142,
                "void spvtools::opt::RegisterLiveness::ComputeLoopRegisterPressure(const Loop &, RegionRegisterLiveness *) const"
               );
}

Assistant:

void RegisterLiveness::ComputeLoopRegisterPressure(
    const Loop& loop, RegionRegisterLiveness* loop_reg_pressure) const {
  loop_reg_pressure->Clear();

  const RegionRegisterLiveness* header_live_inout = Get(loop.GetHeaderBlock());
  loop_reg_pressure->live_in_ = header_live_inout->live_in_;

  std::unordered_set<uint32_t> exit_blocks;
  loop.GetExitBlocks(&exit_blocks);

  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    loop_reg_pressure->live_out_.insert(live_inout->live_in_.begin(),
                                        live_inout->live_in_.end());
  }

  std::unordered_set<uint32_t> seen_insn;
  for (Instruction* insn : loop_reg_pressure->live_out_) {
    loop_reg_pressure->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }
  for (Instruction* insn : loop_reg_pressure->live_in_) {
    if (!seen_insn.count(insn->result_id())) {
      continue;
    }
    loop_reg_pressure->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }

  loop_reg_pressure->used_registers_ = 0;

  for (uint32_t bb_id : loop.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout = Get(bb_id);
    assert(live_inout != nullptr && "Basic block not processed");
    loop_reg_pressure->used_registers_ = std::max(
        loop_reg_pressure->used_registers_, live_inout->used_registers_);

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      loop_reg_pressure->AddRegisterClass(&insn);
    }
  }
}